

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateGeneric::IntStateScatterReactions
          (ChLinkMateGeneric *this,uint off_L,ChVectorDynamic<> *L)

{
  ChVector<double> *pCVar1;
  ChVector<double> *pCVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  pCVar1 = &(this->super_ChLinkMate).super_ChLink.react_force;
  if (pCVar1 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMate).super_ChLink.react_force.m_data[0] = VNULL;
    (this->super_ChLinkMate).super_ChLink.react_force.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkMate).super_ChLink.react_force.m_data[2] = DAT_00b90ac8;
  }
  pCVar2 = &(this->super_ChLinkMate).super_ChLink.react_torque;
  if (pCVar2 != (ChVector<double> *)&VNULL) {
    (this->super_ChLinkMate).super_ChLink.react_torque.m_data[0] = VNULL;
    (this->super_ChLinkMate).super_ChLink.react_torque.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkMate).super_ChLink.react_torque.m_data[2] = DAT_00b90ac8;
  }
  iVar6 = (*(this->super_ChLinkMate).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
            _vptr_ChObj[9])(this);
  if ((char)iVar6 != '\0') {
    uVar7 = 0;
    if (this->c_x == true) {
      if ((this->mask).nconstr < 1) goto LAB_005b3142;
      uVar7 = 1;
      if (((*(this->mask).constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start)->super_ChConstraintTwo).super_ChConstraint.
          active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)off_L) goto LAB_005b3161;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data[off_L];
        auVar8._8_8_ = 0x8000000000000000;
        auVar8._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar9,auVar8);
        dVar3 = (double)vmovlpd_avx(auVar8);
        pCVar1->m_data[0] = dVar3;
      }
    }
    if (this->c_y == true) {
      if ((this->mask).nconstr <= (int)uVar7) goto LAB_005b3142;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar7 + off_L)) goto LAB_005b3161;
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar7 + off_L];
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar10,auVar4);
        dVar3 = (double)vmovlpd_avx(auVar8);
        (this->super_ChLinkMate).super_ChLink.react_force.m_data[1] = dVar3;
      }
      uVar7 = uVar7 + 1;
    }
    if (this->c_z == true) {
      if ((this->mask).nconstr <= (int)uVar7) goto LAB_005b3142;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar7 + off_L)) goto LAB_005b3161;
        auVar11._8_8_ = 0;
        auVar11._0_8_ =
             (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar7 + off_L];
        auVar5._8_8_ = 0x8000000000000000;
        auVar5._0_8_ = 0x8000000000000000;
        auVar8 = vxorpd_avx512vl(auVar11,auVar5);
        dVar3 = (double)vmovlpd_avx(auVar8);
        (this->super_ChLinkMate).super_ChLink.react_force.m_data[2] = dVar3;
      }
      uVar7 = uVar7 + 1;
    }
    if (this->c_rx == true) {
      if ((this->mask).nconstr <= (int)uVar7) goto LAB_005b3142;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar7 + off_L)) goto LAB_005b3161;
        pCVar2->m_data[0] =
             (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar7 + off_L] * -0.5;
      }
      uVar7 = uVar7 + 1;
    }
    if (this->c_ry == true) {
      if ((this->mask).nconstr <= (int)uVar7) goto LAB_005b3142;
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar7 + off_L)) goto LAB_005b3161;
        (this->super_ChLinkMate).super_ChLink.react_torque.m_data[1] =
             (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar7 + off_L] * -0.5;
      }
      uVar7 = uVar7 + 1;
    }
    if (this->c_rz == true) {
      if ((this->mask).nconstr <= (int)uVar7) {
LAB_005b3142:
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      if (((this->mask).constraints.
           super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]->super_ChConstraintTwo).
          super_ChConstraint.active == true) {
        if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)(ulong)(uVar7 + off_L)) {
LAB_005b3161:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        (this->super_ChLinkMate).super_ChLink.react_torque.m_data[2] =
             (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar7 + off_L] * -0.5;
      }
    }
  }
  return;
}

Assistant:

void ChLinkMateGeneric::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    react_force = VNULL;
    react_torque = VNULL;

    if (!this->IsActive())
        return;

    int nc = 0;
    if (c_x) {
        if (mask.Constr_N(nc).IsActive())
            react_force.x() = -L(off_L + nc);
        nc++;
    }
    if (c_y) {
        if (mask.Constr_N(nc).IsActive())
            react_force.y() = -L(off_L + nc);
        nc++;
    }
    if (c_z) {
        if (mask.Constr_N(nc).IsActive())
            react_force.z() = -L(off_L + nc);
        nc++;
    }
    if (c_rx) {
        if (mask.Constr_N(nc).IsActive())
            react_torque.x() = -0.5 * L(off_L + nc);
        nc++;
    }
    if (c_ry) {
        if (mask.Constr_N(nc).IsActive())
            react_torque.y() = -0.5 * L(off_L + nc);
        nc++;
    }
    if (c_rz) {
        if (mask.Constr_N(nc).IsActive())
            react_torque.z() = -0.5 * L(off_L + nc);
        nc++;
    }
}